

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
          (PipelineLayoutCreateInfo *this,
          vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          *setLayouts,deUint32 _pushConstantRangeCount,VkPushConstantRange *_pPushConstantRanges)

{
  VkPushConstantRange *__last;
  VkPushConstantRange *__first;
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  allocator<vk::VkPushConstantRange> local_29;
  VkPushConstantRange *local_28;
  VkPushConstantRange *_pPushConstantRanges_local;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  *pvStack_18;
  deUint32 _pushConstantRangeCount_local;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  *setLayouts_local;
  PipelineLayoutCreateInfo *this_local;
  
  local_28 = _pPushConstantRanges;
  _pPushConstantRanges_local._4_4_ = _pushConstantRangeCount;
  pvStack_18 = setLayouts;
  setLayouts_local =
       (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> *)
       this;
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&this->m_setLayouts,setLayouts);
  __first = local_28;
  __last = local_28 + _pPushConstantRanges_local._4_4_;
  std::allocator<vk::VkPushConstantRange>::allocator(&local_29);
  std::vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>>::
  vector<vk::VkPushConstantRange_const*,void>
            ((vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>> *)
             &this->m_pushConstantRanges,__first,__last,&local_29);
  std::allocator<vk::VkPushConstantRange>::~allocator(&local_29);
  (this->super_VkPipelineLayoutCreateInfo).sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  (this->super_VkPipelineLayoutCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineLayoutCreateInfo).flags = 0;
  sVar1 = std::
          vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
          size(&this->m_setLayouts);
  (this->super_VkPipelineLayoutCreateInfo).setLayoutCount = (deUint32)sVar1;
  if ((this->super_VkPipelineLayoutCreateInfo).setLayoutCount == 0) {
    (this->super_VkPipelineLayoutCreateInfo).pSetLayouts = (VkDescriptorSetLayout *)0x0;
  }
  else {
    pvVar2 = std::
             vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
             ::operator[](&this->m_setLayouts,0);
    (this->super_VkPipelineLayoutCreateInfo).pSetLayouts = pvVar2;
  }
  sVar1 = std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::size
                    (&this->m_pushConstantRanges);
  (this->super_VkPipelineLayoutCreateInfo).pushConstantRangeCount = (deUint32)sVar1;
  if ((this->super_VkPipelineLayoutCreateInfo).pushConstantRangeCount == 0) {
    (this->super_VkPipelineLayoutCreateInfo).pPushConstantRanges = (VkPushConstantRange *)0x0;
  }
  else {
    pvVar3 = std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::
             operator[](&this->m_pushConstantRanges,0);
    (this->super_VkPipelineLayoutCreateInfo).pPushConstantRanges = pvVar3;
  }
  return;
}

Assistant:

PipelineLayoutCreateInfo::PipelineLayoutCreateInfo (const std::vector<vk::VkDescriptorSetLayout>&	setLayouts,
													deUint32										_pushConstantRangeCount,
													const vk::VkPushConstantRange*					_pPushConstantRanges)
	: m_setLayouts			(setLayouts)
	, m_pushConstantRanges	(_pPushConstantRanges, _pPushConstantRanges + _pushConstantRangeCount)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
	pNext = DE_NULL;

	flags			= 0;
	setLayoutCount	= static_cast<deUint32>(m_setLayouts.size());

	if (setLayoutCount)
	{
		pSetLayouts = &m_setLayouts[0];
	}
	else
	{
		pSetLayouts = DE_NULL;
	}

	pushConstantRangeCount = static_cast<deUint32>(m_pushConstantRanges.size());
	if (pushConstantRangeCount) {
		pPushConstantRanges = &m_pushConstantRanges[0];
	}
	else
	{
		pPushConstantRanges = DE_NULL;
	}
}